

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::paintEvent(QTableView *this,QPaintEvent *event)

{
  bool bVar1;
  bool bVar2;
  QTableViewPrivate *this_00;
  QPoint QVar3;
  QHeaderView *this_01;
  QHeaderView *this_02;
  QWidget *pQVar4;
  QWidgetData *pQVar5;
  QAbstractItemModel *pQVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int logicalIndex;
  int iVar25;
  int iVar26;
  uint uVar27;
  QStyle *pQVar28;
  int *piVar29;
  int *piVar30;
  QPen *pQVar31;
  int iVar32;
  uint uVar33;
  char *pcVar34;
  int h;
  uint uVar35;
  int firstVisualColumn;
  uint logicalIndex_00;
  uint visualIndex;
  QPaintDevice *pQVar36;
  int visualColumnIndex;
  int iVar37;
  byte bVar38;
  long in_FS_OFFSET;
  undefined1 auVar39 [16];
  byte local_268;
  QLineF local_198;
  QLineF local_178;
  QPen old;
  QRegion region;
  QArrayDataPointer<char> local_148;
  QPainter painter;
  QPen gridPen;
  Representation local_120;
  Representation RStack_11c;
  undefined8 local_118;
  undefined4 local_110;
  undefined4 local_10c;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&local_108);
  QVar3 = (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset;
  bVar1 = this_00->showGrid;
  uVar9 = (uint)bVar1;
  pQVar28 = QWidget::style((QWidget *)this);
  uVar10 = (**(code **)(*(long *)pQVar28 + 0xf0))(pQVar28,0x22,&local_108,this,0);
  local_10c = 0xaaaaaaaa;
  auVar39 = QColor::fromRgba(uVar10);
  local_118 = auVar39._0_8_;
  local_110 = auVar39._8_4_;
  local_10c = CONCAT22(local_10c._2_2_,auVar39._12_2_);
  _gridPen = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_178,(QColor *)&local_118,SolidPattern);
  QPen::QPen(&gridPen,(QBrush *)&local_178,1.0,this_00->gridStyle,SquareCap,BevelJoin);
  QBrush::~QBrush((QBrush *)&local_178);
  this_01 = this_00->verticalHeader;
  this_02 = this_00->horizontalHeader;
  bVar2 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  bVar7 = QWidget::isRightToLeft((QWidget *)this);
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  pQVar36 = &pQVar4->super_QPaintDevice;
  if (pQVar4 == (QWidget *)0x0) {
    pQVar36 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter(&painter,pQVar36);
  iVar11 = QHeaderView::count(this_02);
  if (((iVar11 != 0) && (iVar11 = QHeaderView::count(this_01), iVar11 != 0)) &&
     (bVar8 = QPointer::operator_cast_to_bool
                        ((QPointer *)&(this_00->super_QAbstractItemViewPrivate).itemDelegate), bVar8
     )) {
    iVar12 = QHeaderView::length(this_02);
    iVar13 = QHeaderView::offset(this_02);
    iVar14 = QHeaderView::length(this_01);
    uVar10 = QHeaderView::offset(this_01);
    iVar11 = QHeaderView::visualIndexAt(this_01,0);
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    pQVar5 = (this_01->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
             .data;
    iVar15 = QHeaderView::visualIndexAt
                       (this_01,((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1);
    if (iVar15 == -1) {
      pQVar6 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_178,&(this_00->super_QAbstractItemViewPrivate).root);
      iVar15 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6);
      iVar15 = iVar15 + -1;
    }
    iVar16 = QHeaderView::visualIndexAt(this_02,0);
    pQVar5 = (this_02->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
             .data;
    iVar17 = QHeaderView::visualIndexAt
                       (this_02,((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1);
    firstVisualColumn = iVar16;
    if (bVar7) {
      firstVisualColumn = iVar17;
      iVar17 = iVar16;
    }
    if (firstVisualColumn == -1) {
      firstVisualColumn = 0;
    }
    if (iVar17 == -1) {
      iVar17 = QHeaderView::count(this_02);
      iVar17 = iVar17 + -1;
    }
    iVar16 = (iVar17 - firstVisualColumn) + 1;
    local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QBitArray::QBitArray((QBitArray *)&local_148,(long)(((iVar15 - iVar11) + 1) * iVar16),false);
    region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::translated(&region,(QPoint *)(event + 0x20));
    if ((QSpanCollection *)
        (this_00->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_00->spans) {
      QTableViewPrivate::drawAndClipSpans
                (this_00,&region,&painter,&local_108,(QBitArray *)&local_148,iVar11,iVar15,
                 firstVisualColumn,iVar17);
    }
    iVar12 = (iVar12 - iVar13) - (uint)!bVar7;
    piVar29 = (int *)QRegion::begin();
    piVar30 = (int *)QRegion::end();
    bVar38 = ((char)iVar17 - (char)firstVisualColumn) + 1;
    for (; piVar29 != piVar30; piVar29 = piVar29 + 4) {
      iVar13 = *piVar29;
      iVar15 = piVar29[2];
      iVar17 = piVar29[3];
      if ((int)(iVar14 + ~uVar10) <= piVar29[3]) {
        iVar17 = iVar14 + ~uVar10;
      }
      if (bVar7) {
        pQVar5 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar32 = ((pQVar5->crect).x2.m_i - ((pQVar5->crect).x1.m_i + iVar12)) + 1;
        if (iVar13 <= iVar32) {
          iVar13 = iVar32;
        }
      }
      else if (iVar12 <= iVar15) {
        iVar15 = iVar12;
      }
      if ((iVar13 <= iVar15) && (iVar32 = piVar29[1], iVar32 <= iVar17)) {
        iVar18 = QHeaderView::visualIndexAt(this_02,iVar13);
        iVar19 = QHeaderView::visualIndexAt(this_02,iVar15);
        iVar20 = iVar19;
        if (bVar7) {
          iVar20 = iVar18;
          iVar18 = iVar19;
        }
        if (iVar18 == -1) {
          iVar18 = 0;
        }
        if (iVar20 == -1) {
          iVar20 = QHeaderView::count(this_02);
          iVar20 = iVar20 + -1;
        }
        iVar19 = QHeaderView::visualIndexAt(this_01,iVar17);
        if (iVar19 == -1) {
          iVar19 = QHeaderView::count(this_01);
          iVar19 = iVar19 + -1;
        }
        if ((bVar2 == false) || (bVar8 = QHeaderView::sectionsHidden(this_01), !bVar8)) {
          logicalIndex_00 = QHeaderView::visualIndexAt(this_01,iVar32);
          uVar35 = logicalIndex_00 & 1;
          if ((logicalIndex_00 & 1) != 0) {
            uVar35 = (uint)bVar2;
          }
        }
        else {
          iVar21 = QHeaderView::offset(this_01);
          iVar37 = 0;
          QHeaderView::logicalIndex(this_01,0);
          uVar35 = 0;
          logicalIndex_00 = 0;
          while( true ) {
            iVar22 = QHeaderView::sectionSize(this_01,logicalIndex_00);
            iVar37 = iVar22 + iVar37;
            if ((iVar21 < iVar37) || (iVar19 <= (int)logicalIndex_00)) break;
            iVar22 = QHeaderView::logicalIndex(this_01,logicalIndex_00);
            bVar8 = QHeaderView::isSectionHidden(this_01,iVar22);
            local_268 = (byte)uVar35;
            logicalIndex_00 = logicalIndex_00 + 1;
            uVar35 = (bVar8 ^ local_268) ^ 1;
          }
        }
        if ((logicalIndex_00 != 0xffffffff) && ((int)logicalIndex_00 <= iVar19)) {
          iVar21 = (logicalIndex_00 - iVar11) * iVar16 - firstVisualColumn;
          uVar27 = (uint)(byte)(bVar38 * ((char)logicalIndex_00 - (char)iVar11) -
                               (char)firstVisualColumn);
          visualIndex = logicalIndex_00;
          while( true ) {
            local_120 = QVar3.xp.m_i;
            RStack_11c = QVar3.yp.m_i;
            if (iVar19 < (int)visualIndex) break;
            iVar37 = QHeaderView::logicalIndex(this_01,visualIndex);
            bVar8 = QHeaderView::isSectionHidden(this_01,iVar37);
            if (!bVar8) {
              iVar23 = rowViewportPosition(this,iVar37);
              iVar24 = rowHeight(this,iVar37);
              for (iVar22 = iVar18; iVar22 <= iVar20; iVar22 = iVar22 + 1) {
                uVar33 = iVar21 + iVar22;
                if (-1 < (int)uVar33) {
                  pcVar34 = local_148.ptr;
                  if (local_148.ptr == (char *)0x0) {
                    pcVar34 = (char *)&QByteArray::_empty;
                  }
                  if (((long)(ulong)uVar33 < local_148.size * 8 - (long)*pcVar34) &&
                     (((byte)local_148.ptr[(ulong)(uVar33 >> 3) + 1] >> (uVar27 + iVar22 & 7) & 1)
                      == 0)) {
                    QBitArray::setBit((QBitArray *)&local_148,(ulong)uVar33);
                    logicalIndex = QHeaderView::logicalIndex(this_02,iVar22);
                    bVar8 = QHeaderView::isSectionHidden(this_02,logicalIndex);
                    if (!bVar8) {
                      iVar25 = columnViewportPosition(this,logicalIndex);
                      iVar26 = columnWidth(this,logicalIndex);
                      local_178.pt2.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                      local_178.pt1.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                      local_178.pt1.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                      pQVar6 = (this_00->super_QAbstractItemViewPrivate).model;
                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                ((QModelIndex *)&local_198,
                                 &(this_00->super_QAbstractItemViewPrivate).root);
                      (**(code **)(*(long *)pQVar6 + 0x60))
                                (&local_178,pQVar6,iVar37,logicalIndex,&local_198);
                      if (((-1 < local_178.pt1.xp._0_4_) && (-1 < (long)local_178.pt1.xp)) &&
                         ((undefined1 *)local_178.pt2.xp != (undefined1 *)0x0)) {
                        local_108.super_QStyleOption.rect.x1.m_i =
                             iVar25 + (uint)(byte)(bVar7 & bVar1) + local_120.m_i;
                        local_108.super_QStyleOption.rect.x2.m_i =
                             iVar26 + ~uVar9 + local_108.super_QStyleOption.rect.x1.m_i;
                        if (bVar2 != false) {
                          local_108.features.
                          super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
                               (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
                               ((uint)local_108.features.
                                      super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                      .super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i
                                & 0xfffffffd | (uVar35 & 1) * 2);
                        }
                        local_108.super_QStyleOption.rect.y1.m_i = iVar23 + RStack_11c.m_i;
                        local_108.super_QStyleOption.rect.y2.m_i =
                             iVar24 + ~uVar9 + iVar23 + RStack_11c.m_i;
                        QTableViewPrivate::drawCell
                                  (this_00,&painter,&local_108,(QModelIndex *)&local_178);
                      }
                    }
                  }
                }
              }
              uVar33 = uVar35 & 1;
              uVar35 = (uint)bVar2;
              if (uVar33 != 0) {
                uVar35 = 0;
              }
            }
            visualIndex = visualIndex + 1;
            iVar21 = iVar21 + iVar16;
            uVar27 = uVar27 + bVar38;
          }
          if (uVar9 != 0) {
            do {
              iVar21 = iVar19;
              iVar19 = QHeaderView::logicalIndex(this_01,iVar21);
              bVar8 = QHeaderView::isSectionHidden(this_01,iVar19);
              iVar19 = iVar21 + -1;
            } while (bVar8);
            _old = &DAT_aaaaaaaaaaaaaaaa;
            pQVar31 = (QPen *)QPainter::pen();
            QPen::QPen(&old,pQVar31);
            QPainter::setPen((QPen *)&painter);
            for (uVar35 = logicalIndex_00; (int)uVar35 <= iVar21; uVar35 = uVar35 + 1) {
              iVar19 = QHeaderView::logicalIndex(this_01,uVar35);
              bVar8 = QHeaderView::isSectionHidden(this_01,iVar19);
              if (!bVar8) {
                iVar37 = rowViewportPosition(this,iVar19);
                iVar19 = rowHeight(this,iVar19);
                local_178.pt1.yp = (qreal)(int)(iVar19 + (iVar37 - uVar9) + RStack_11c.m_i);
                local_178.pt1.xp = (qreal)(double)iVar13;
                local_178.pt2.xp = (qreal)(double)iVar15;
                local_178.pt2.yp = local_178.pt1.yp;
                QLineF::translated(&local_198,&local_178,0.5,0.5);
                QPainter::drawLine(&painter,&local_198);
              }
            }
            for (iVar19 = iVar18; iVar19 <= iVar20; iVar19 = iVar19 + 1) {
              iVar21 = QHeaderView::logicalIndex(this_02,iVar19);
              bVar8 = QHeaderView::isSectionHidden(this_02,iVar21);
              if (!bVar8) {
                iVar37 = columnViewportPosition(this,iVar21);
                iVar37 = iVar37 + local_120.m_i;
                if (!bVar7) {
                  iVar21 = columnWidth(this,iVar21);
                  iVar37 = (iVar37 - uVar9) + iVar21;
                }
                local_178.pt1.xp = (qreal)iVar37;
                local_178.pt1.yp = (qreal)(double)iVar32;
                local_178.pt2.xp = local_178.pt1.xp;
                local_178.pt2.yp = (qreal)(double)iVar17;
                QLineF::translated(&local_198,&local_178,0.5,0.5);
                QPainter::drawLine(&painter,&local_198);
              }
            }
            pQVar28 = QWidget::style((QWidget *)this);
            iVar20 = (**(code **)(*(long *)pQVar28 + 0xf0))(pQVar28,0x76,&local_108,this,0);
            if (iVar20 != 0) {
              if ((((this_02->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.data)->widget_attributes & 0x10000) != 0) {
                iVar20 = QHeaderView::logicalIndex(this_01,logicalIndex_00);
                bVar8 = QHeaderView::isSectionHidden(this_01,iVar20);
                if ((!bVar8) &&
                   (iVar20 = rowViewportPosition(this,iVar20), iVar20 + RStack_11c.m_i == iVar32)) {
                  QPainter::drawLine(&painter,iVar13,iVar32,iVar15,iVar32);
                }
              }
              if ((((this_01->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.data)->widget_attributes & 0x10000) != 0) {
                iVar20 = QHeaderView::logicalIndex(this_02,iVar18);
                bVar8 = QHeaderView::isSectionHidden(this_02,iVar20);
                if (!bVar8) {
                  iVar20 = columnViewportPosition(this,iVar20);
                  iVar20 = iVar20 + local_120.m_i;
                  bVar8 = QWidget::isLeftToRight((QWidget *)this);
                  if (!bVar8) {
                    iVar18 = columnWidth(this,iVar18);
                    iVar20 = iVar20 + iVar18 + -1;
                  }
                  bVar8 = QWidget::isLeftToRight((QWidget *)this);
                  if ((bVar8) && (iVar20 == iVar13)) {
                    QPainter::drawLine(&painter,iVar13,iVar32,iVar13,iVar17);
                  }
                  bVar8 = QWidget::isLeftToRight((QWidget *)this);
                  if ((!bVar8) && (iVar20 == iVar15)) {
                    QPainter::drawLine(&painter,iVar15,iVar32,iVar15,iVar17);
                  }
                }
              }
            }
            QPainter::setPen((QPen *)&painter);
            QPen::~QPen(&old);
          }
        }
      }
    }
    QAbstractItemViewPrivate::paintDropIndicator(&this_00->super_QAbstractItemViewPrivate,&painter);
    QRegion::~QRegion(&region);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_148);
  }
  QPainter::~QPainter(&painter);
  QPen::~QPen(&gridPen);
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::paintEvent(QPaintEvent *event)
{
    Q_D(QTableView);
    // setup temp variables for the painting
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QPoint offset = d->scrollDelayOffset;
    const bool showGrid = d->showGrid;
    const int gridSize = showGrid ? 1 : 0;
    const int gridHint = style()->styleHint(QStyle::SH_Table_GridLineColor, &option, this);
    const QColor gridColor = QColor::fromRgba(static_cast<QRgb>(gridHint));
    const QPen gridPen = QPen(gridColor, 1, d->gridStyle);
    const QHeaderView *verticalHeader = d->verticalHeader;
    const QHeaderView *horizontalHeader = d->horizontalHeader;
    const bool alternate = d->alternatingColors;
    const bool rightToLeft = isRightToLeft();

    QPainter painter(d->viewport);

    // if there's nothing to do, clear the area and return
    if (horizontalHeader->count() == 0 || verticalHeader->count() == 0 || !d->itemDelegate)
        return;

    const int x = horizontalHeader->length() - horizontalHeader->offset() - (rightToLeft ? 0 : 1);
    const int y = verticalHeader->length() - verticalHeader->offset() - 1;

    //firstVisualRow is the visual index of the first visible row.  lastVisualRow is the visual index of the last visible Row.
    //same goes for ...VisualColumn
    int firstVisualRow = qMax(verticalHeader->visualIndexAt(0),0);
    int lastVisualRow = verticalHeader->visualIndexAt(verticalHeader->height());
    if (lastVisualRow == -1)
        lastVisualRow = d->model->rowCount(d->root) - 1;

    int firstVisualColumn = horizontalHeader->visualIndexAt(0);
    int lastVisualColumn = horizontalHeader->visualIndexAt(horizontalHeader->width());
    if (rightToLeft)
        qSwap(firstVisualColumn, lastVisualColumn);
    if (firstVisualColumn == -1)
        firstVisualColumn = 0;
    if (lastVisualColumn == -1)
        lastVisualColumn = horizontalHeader->count() - 1;

    QBitArray drawn((lastVisualRow - firstVisualRow + 1) * (lastVisualColumn - firstVisualColumn + 1));

    const QRegion region = event->region().translated(offset);

    if (d->hasSpans()) {
        d->drawAndClipSpans(region, &painter, option, &drawn,
                             firstVisualRow, lastVisualRow, firstVisualColumn, lastVisualColumn);
    }

    for (QRect dirtyArea : region) {
        dirtyArea.setBottom(qMin(dirtyArea.bottom(), int(y)));
        if (rightToLeft) {
            dirtyArea.setLeft(qMax(dirtyArea.left(), d->viewport->width() - int(x)));
        } else {
            dirtyArea.setRight(qMin(dirtyArea.right(), int(x)));
        }
        // dirtyArea may be invalid when the horizontal header is not stretched
        if (!dirtyArea.isValid())
            continue;

        // get the horizontal start and end visual sections
        int left = horizontalHeader->visualIndexAt(dirtyArea.left());
        int right = horizontalHeader->visualIndexAt(dirtyArea.right());
        if (rightToLeft)
            qSwap(left, right);
        if (left == -1) left = 0;
        if (right == -1) right = horizontalHeader->count() - 1;

        // get the vertical start and end visual sections and if alternate color
        int bottom = verticalHeader->visualIndexAt(dirtyArea.bottom());
        if (bottom == -1) bottom = verticalHeader->count() - 1;
        int top = 0;
        bool alternateBase = false;
        if (alternate && verticalHeader->sectionsHidden()) {
            const int verticalOffset = verticalHeader->offset();
            int row = verticalHeader->logicalIndex(top);
            for (int y = 0;
                 ((y += verticalHeader->sectionSize(top)) <= verticalOffset) && (top < bottom);
                 ++top) {
                row = verticalHeader->logicalIndex(top);
                if (alternate && !verticalHeader->isSectionHidden(row))
                    alternateBase = !alternateBase;
            }
        } else {
            top = verticalHeader->visualIndexAt(dirtyArea.top());
            alternateBase = (top & 1) && alternate;
        }
        if (top == -1 || top > bottom)
            continue;

        // Paint each row item
        for (int visualRowIndex = top; visualRowIndex <= bottom; ++visualRowIndex) {
            int row = verticalHeader->logicalIndex(visualRowIndex);
            if (verticalHeader->isSectionHidden(row))
                continue;
            int rowY = rowViewportPosition(row);
            rowY += offset.y();
            int rowh = rowHeight(row) - gridSize;

            // Paint each column item
            for (int visualColumnIndex = left; visualColumnIndex <= right; ++visualColumnIndex) {
                int currentBit = (visualRowIndex - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                        + visualColumnIndex - firstVisualColumn;

                if (currentBit < 0 || currentBit >= drawn.size() || drawn.testBit(currentBit))
                    continue;
                drawn.setBit(currentBit);

                int col = horizontalHeader->logicalIndex(visualColumnIndex);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                int colw = columnWidth(col) - gridSize;

                const QModelIndex index = d->model->index(row, col, d->root);
                if (index.isValid()) {
                    option.rect = QRect(colp + (showGrid && rightToLeft ? 1 : 0), rowY, colw, rowh);
                    if (alternate) {
                        if (alternateBase)
                            option.features |= QStyleOptionViewItem::Alternate;
                        else
                            option.features &= ~QStyleOptionViewItem::Alternate;
                    }
                    d->drawCell(&painter, option, index);
                }
            }
            alternateBase = !alternateBase && alternate;
        }

        if (showGrid) {
            // Find the bottom right (the last rows/columns might be hidden)
            while (verticalHeader->isSectionHidden(verticalHeader->logicalIndex(bottom))) --bottom;
            QPen old = painter.pen();
            painter.setPen(gridPen);
            // Paint each row
            for (int visualIndex = top; visualIndex <= bottom; ++visualIndex) {
                int row = verticalHeader->logicalIndex(visualIndex);
                if (verticalHeader->isSectionHidden(row))
                    continue;
                int rowY = rowViewportPosition(row);
                rowY += offset.y();
                int rowh = rowHeight(row) - gridSize;
                QLineF line(dirtyArea.left(), rowY + rowh, dirtyArea.right(), rowY + rowh);
                painter.drawLine(line.translated(0.5, 0.5));
            }

            // Paint each column
            for (int h = left; h <= right; ++h) {
                int col = horizontalHeader->logicalIndex(h);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                if (!rightToLeft)
                    colp +=  columnWidth(col) - gridSize;
                QLineF line(colp, dirtyArea.top(), colp, dirtyArea.bottom());
                painter.drawLine(line.translated(0.5, 0.5));
            }
            const bool drawWhenHidden = style()->styleHint(QStyle::SH_Table_AlwaysDrawLeftTopGridLines,
                                                           &option, this);
            if (drawWhenHidden && horizontalHeader->isHidden()) {
                const int row = verticalHeader->logicalIndex(top);
                if (!verticalHeader->isSectionHidden(row)) {
                    const int rowY = rowViewportPosition(row) + offset.y();
                    if (rowY == dirtyArea.top())
                        painter.drawLine(dirtyArea.left(), rowY, dirtyArea.right(), rowY);
                }
            }
            if (drawWhenHidden && verticalHeader->isHidden()) {
                const int col = horizontalHeader->logicalIndex(left);
                if (!horizontalHeader->isSectionHidden(col)) {
                    int colX = columnViewportPosition(col) + offset.x();
                    if (!isLeftToRight())
                        colX += columnWidth(left) - 1;
                    if (isLeftToRight() && colX == dirtyArea.left())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                    if (!isLeftToRight() && colX == dirtyArea.right())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                }
            }
            painter.setPen(old);
        }
    }

#if QT_CONFIG(draganddrop)
    // Paint the dropIndicator
    d->paintDropIndicator(&painter);
#endif
}